

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O3

void fdb_load_inmem_stale_info(fdb_kvs_handle *handle)

{
  ulong uVar1;
  btree_result bVar2;
  int64_t iVar3;
  uint64_t offset;
  ulong revnum;
  bool bVar4;
  bid_t _offset;
  filemgr *local_128;
  filemgr_header_revnum_t _revnum;
  docio_object doc;
  btree_iterator bit;
  uint8_t keybuf [64];
  
  local_128 = handle->file;
  doc.length.keylen = 0;
  doc.length.metalen = 0;
  doc.length.bodylen = 0;
  doc.length.bodylen_ondisk = 0;
  doc.length.flag = '\0';
  doc.length.checksum = '\0';
  doc.length.reserved = 0;
  doc._16_8_ = doc._16_8_ & 0xffffffff00000000;
  doc.key = (void *)0x0;
  doc.field_3.seqnum = 0;
  doc.meta = (void *)0x0;
  doc.body = (void *)0x0;
  LOCK();
  bVar4 = (local_128->stale_info_tree_loaded)._M_base._M_i == false;
  if (bVar4) {
    (local_128->stale_info_tree_loaded)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar4) {
    filemgr_mutex_lock(local_128);
    btree_iterator_init(handle->staletree,&bit,(void *)0x0);
    bVar2 = btree_next(&bit,&_revnum,&_offset);
    btreeblk_end(handle->bhandle);
    if (bVar2 == BTREE_RESULT_SUCCESS) {
      do {
        if (_offset != 0xffffffffffffffff) {
          revnum = _revnum >> 0x38 | (_revnum & 0xff000000000000) >> 0x28 |
                   (_revnum & 0xff0000000000) >> 0x18 | (_revnum & 0xff00000000) >> 8 |
                   (_revnum & 0xff000000) << 8 | (_revnum & 0xff0000) << 0x18 |
                   (_revnum & 0xff00) << 0x28 | _revnum << 0x38;
          offset = _offset >> 0x38 | (_offset & 0xff000000000000) >> 0x28 |
                   (_offset & 0xff0000000000) >> 0x18 | (_offset & 0xff00000000) >> 8 |
                   (_offset & 0xff000000) << 8 | (_offset & 0xff0000) << 0x18 |
                   (_offset & 0xff00) << 0x28 | _offset << 0x38;
          do {
            doc.timestamp = 0;
            doc._20_4_ = 0;
            doc.field_3.seqnum = 0;
            doc.meta = (void *)0x0;
            doc.length.keylen = 0;
            doc.length.metalen = 0;
            doc.length.bodylen = 0;
            doc.length.bodylen_ondisk = 0;
            doc.length.flag = '\0';
            doc.length.checksum = '\0';
            doc.length.reserved = 0;
            doc.body = (void *)0x0;
            doc.key = keybuf;
            iVar3 = docio_read_doc(handle->dhandle,offset,&doc,true);
            if (iVar3 < 1) {
              fdb_log_impl((err_log_callback *)0x0,2,(fdb_status)iVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                           ,"fdb_load_inmem_stale_info",0xba,
                           "Error in reading a stale region info document from a database file \'%s\': revnum %lu, offset %lu\n"
                           ,local_128->filename,revnum,offset);
              break;
            }
            fdb_add_inmem_stale_info((fdb_kvs_handle *)handle->file,revnum,&doc,offset,false);
            uVar1 = *doc.body;
            offset = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
            _offset = uVar1;
            free(doc.body);
          } while (uVar1 != 0xffffffffffffffff);
        }
        bVar2 = btree_next(&bit,&_revnum,&_offset);
        btreeblk_end(handle->bhandle);
      } while (bVar2 == BTREE_RESULT_SUCCESS);
    }
    btree_iterator_free(&bit);
    filemgr_mutex_unlock(local_128);
  }
  return;
}

Assistant:

void fdb_load_inmem_stale_info(fdb_kvs_handle *handle)
{
    uint8_t keybuf[64];
    int64_t ret;
    bid_t offset, _offset, prev_offset;
    filemgr_header_revnum_t revnum, _revnum;
    btree_iterator bit;
    btree_result br;
    struct filemgr *file = handle->file;
    struct docio_object doc;
    bool expected = false;

    if (!std::atomic_compare_exchange_strong(&file->stale_info_tree_loaded,
                                             &expected, true)) {
        // stale info is already loaded (fast screening without mutex)
        return;
    }

    // first open of the DB file
    // should grab mutex to avoid race with other writer
    filemgr_mutex_lock(file);

    btree_iterator_init(handle->staletree, &bit, NULL);
    do {
        br = btree_next(&bit, (void*)&_revnum, (void*)&_offset);
        btreeblk_end(handle->bhandle);
        if (br != BTREE_RESULT_SUCCESS) {
            break;
        }

        revnum = _endian_decode(_revnum);
        offset = _endian_decode(_offset);

        while (offset != BLK_NOT_FOUND) {
            memset(&doc, 0x0, sizeof(doc));
            // pre-allocated buffer for key
            doc.key = (void*)keybuf;

            ret = docio_read_doc(handle->dhandle, offset, &doc, true);
            if (ret <= 0) {
                // read fail .. escape
                fdb_log(NULL, FDB_LOG_ERROR, (fdb_status)ret,
                        "Error in reading a stale region info document "
                        "from a database file '%s'"
                        ": revnum %" _F64 ", offset %" _F64 "\n",
                        file->filename, revnum, offset);
                offset = BLK_NOT_FOUND;
                continue;
            }

            fdb_add_inmem_stale_info(handle, revnum, &doc, offset, false);

            // fetch previous doc offset
            memcpy(&_offset, doc.body, sizeof(_offset));
            prev_offset = _endian_decode(_offset);

            // We don't need to free 'meta' as it will be NULL.
            free(doc.body);

            offset = prev_offset;
        }
    } while (true);
    btree_iterator_free(&bit);

    filemgr_mutex_unlock(file);
}